

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_node_tec_part
          (REF_NODE ref_node,REF_GLOB nnode,REF_GLOB *l2c,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  REF_MPI pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  REF_INT *sorted_index;
  REF_GLOB *original;
  void *pvVar6;
  void *output;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  ulong uVar15;
  int iVar16;
  char *pcVar17;
  uint uVar18;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS RVar19;
  size_t sVar20;
  void *pvVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  REF_INT position;
  ulong local_f8;
  uint local_cc;
  int local_a4;
  ulong local_a0;
  double *local_98;
  long local_90;
  long local_88;
  FILE *local_80;
  REF_MPI local_78;
  long local_70;
  size_t local_68;
  ulong local_60;
  ulong local_58;
  void *local_50;
  ulong local_48;
  long local_40;
  REF_DBL *local_38;
  
  pRVar1 = ref_node->ref_mpi;
  iVar16 = ref_node->max;
  lVar13 = (long)iVar16;
  if (lVar13 < 1) {
    uVar3 = 0;
LAB_0017b0f3:
    sVar20 = (ulong)uVar3 * 4;
    local_80 = (FILE *)file;
    local_38 = scalar;
    sorted_index = (REF_INT *)malloc(sVar20);
    if (sorted_index == (REF_INT *)0x0) {
      pcVar17 = "malloc sorted_local of REF_INT NULL";
      uVar11 = 0x96;
    }
    else {
      original = (REF_GLOB *)malloc((ulong)uVar3 << 3);
      if (original == (REF_GLOB *)0x0) {
        pcVar17 = "malloc sorted_cellnode of REF_GLOB NULL";
        uVar11 = 0x97;
      }
      else {
        pvVar6 = malloc(sVar20);
        if (pvVar6 == (void *)0x0) {
          pcVar17 = "malloc pack of REF_INT NULL";
          uVar11 = 0x98;
        }
        else {
          if (iVar16 < 1) {
            local_f8 = 0;
            uVar3 = ref_sort_heap_glob(0,original,sorted_index);
            if (uVar3 != 0) goto LAB_0017b287;
          }
          else {
            lVar8 = 0;
            local_f8 = 0;
            do {
              if ((l2c[lVar8] != -1) && (pRVar1->id == ref_node->part[lVar8])) {
                iVar16 = (int)local_f8;
                original[iVar16] = l2c[lVar8];
                *(int *)((long)pvVar6 + (long)iVar16 * 4) = (int)lVar8;
                local_f8 = (ulong)(iVar16 + 1);
              }
              lVar8 = lVar8 + 1;
            } while (lVar13 != lVar8);
            uVar3 = ref_sort_heap_glob((REF_INT)local_f8,original,sorted_index);
            if (uVar3 != 0) {
LAB_0017b287:
              pcVar17 = "sort";
              uVar11 = 0xa3;
LAB_0017b2ab:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar11,"ref_gather_node_tec_part",(ulong)uVar3,pcVar17);
              return uVar3;
            }
            if (0 < (REF_INT)local_f8) {
              uVar9 = 0;
              do {
                iVar16 = *(int *)((long)pvVar6 + (long)sorted_index[uVar9] * 4);
                sorted_index[uVar9] = iVar16;
                original[uVar9] = l2c[iVar16];
                uVar9 = uVar9 + 1;
              } while (local_f8 != uVar9);
            }
          }
          uVar3 = ldim + 4;
          free(pvVar6);
          iVar4 = (int)(nnode / (long)pRVar1->n) + 1;
          iVar16 = 100000;
          if (100000 < iVar4) {
            iVar16 = iVar4;
          }
          if ((0 < pRVar1->reduce_byte_limit) &&
             (iVar4 = pRVar1->reduce_byte_limit / (int)(uVar3 * 8), iVar4 <= iVar16)) {
            iVar16 = iVar4;
          }
          uVar18 = iVar16 * uVar3;
          if ((int)uVar18 < 0) {
            pcVar17 = "malloc local_xyzm of REF_DBL negative";
            uVar11 = 0xaf;
            goto LAB_0017b0df;
          }
          sVar20 = (ulong)uVar18 << 3;
          pvVar6 = malloc(sVar20);
          if (pvVar6 == (void *)0x0) {
            pcVar17 = "malloc local_xyzm of REF_DBL NULL";
            uVar11 = 0xaf;
          }
          else {
            local_68 = sVar20;
            output = malloc(sVar20);
            if (output != (void *)0x0) {
              local_a0 = (ulong)uVar3;
              if (0 < nnode) {
                uVar5 = ldim + 3;
                local_70 = (long)iVar16;
                local_58 = 1;
                if (1 < (int)uVar5) {
                  local_58 = (ulong)uVar5;
                }
                local_90 = (long)(int)uVar3;
                local_60 = (ulong)(uint)ldim;
                local_98 = (double *)((long)pvVar6 + (long)(int)uVar5 * 8);
                local_50 = (void *)((long)output + (long)(int)uVar5 * 8);
                local_40 = local_90 << 0x20;
                local_88 = local_90 * 8;
                local_cc = 0;
                lVar13 = 0;
                local_78 = pRVar1;
                do {
                  pRVar1 = local_78;
                  lVar8 = nnode - lVar13;
                  if (local_70 <= nnode - lVar13) {
                    lVar8 = local_70;
                  }
                  if (uVar18 != 0) {
                    memset(pvVar6,0,local_68);
                  }
                  uVar5 = (uint)lVar8;
                  if (0 < (int)uVar5) {
                    uVar22 = (ulong)(uVar5 & 0x7fffffff);
                    lVar8 = 0x300000000;
                    uVar9 = 0;
                    do {
                      uVar3 = ref_sort_search_glob
                                        ((REF_INT)local_f8,original,lVar13 + uVar9,&local_a4);
                      if ((uVar3 != 0) && (uVar3 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0xbf,"ref_gather_node_tec_part",(ulong)uVar3,"node local failed");
                        local_cc = uVar3;
                      }
                      if (uVar3 != 5) {
                        if (uVar3 != 0) {
                          return local_cc;
                        }
                        lVar10 = (long)sorted_index[local_a4];
                        lVar7 = uVar9 * local_90;
                        pRVar2 = ref_node->real;
                        *(REF_DBL *)((long)pvVar6 + lVar7 * 8) = pRVar2[lVar10 * 0xf];
                        *(REF_DBL *)((long)pvVar6 + lVar7 * 8 + 8) = pRVar2[lVar10 * 0xf + 1];
                        *(REF_DBL *)((long)pvVar6 + lVar7 * 8 + 0x10) = pRVar2[lVar10 * 0xf + 2];
                        if (0 < ldim) {
                          uVar15 = 0;
                          lVar12 = lVar8;
                          do {
                            *(REF_DBL *)((long)pvVar6 + (lVar12 >> 0x1d)) =
                                 local_38[lVar10 * ldim + uVar15];
                            uVar15 = uVar15 + 1;
                            lVar12 = lVar12 + 0x100000000;
                          } while (local_60 != uVar15);
                        }
                        local_98[lVar7] = 1.0;
                      }
                      uVar9 = uVar9 + 1;
                      lVar8 = lVar8 + local_40;
                    } while (uVar9 != uVar22);
                    pdVar14 = local_98;
                    lVar8 = lVar13;
                    if (0 < (int)uVar5) {
                      do {
                        dVar24 = *pdVar14;
                        dVar23 = dVar24 + -1.0;
                        if (dVar23 <= -dVar23) {
                          dVar23 = -dVar23;
                        }
                        if (0.1 < dVar23) {
                          if (dVar24 <= -dVar24) {
                            dVar24 = -dVar24;
                          }
                          if (0.1 < dVar24) {
                            printf("%s: %d: %s: before sum %ld %f\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0xd0,"ref_gather_node_tec_part",lVar8);
                          }
                        }
                        pdVar14 = (double *)((long)pdVar14 + local_88);
                        lVar8 = lVar8 + 1;
                        uVar22 = uVar22 - 1;
                      } while (uVar22 != 0);
                    }
                  }
                  uVar3 = ref_mpi_sum(pRVar1,pvVar6,output,(int)local_a0 * uVar5,3);
                  if (uVar3 != 0) {
                    pcVar17 = "sum";
                    uVar11 = 0xd4;
                    goto LAB_0017b2ab;
                  }
                  if ((pRVar1->id == 0) && (0 < (int)uVar5)) {
                    local_48 = (ulong)(uVar5 & 0x7fffffff);
                    uVar9 = 0;
                    pvVar21 = output;
                    do {
                      dVar24 = *(double *)((long)local_50 + uVar9 * local_90 * 8) + -1.0;
                      if (dVar24 <= -dVar24) {
                        dVar24 = -dVar24;
                      }
                      if (0.1 < dVar24) {
                        printf("%s: %d: %s: after sum %ld %f\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0xda,"ref_gather_node_tec_part",lVar13 + uVar9);
                      }
                      uVar22 = local_58;
                      if (-3 < ldim) {
                        uVar15 = 0;
                        do {
                          fprintf(local_80," %.15e",*(undefined8 *)((long)pvVar21 + uVar15 * 8));
                          uVar15 = uVar15 + 1;
                        } while (uVar22 != uVar15);
                      }
                      fwrite(" \n",2,1,local_80);
                      uVar9 = uVar9 + 1;
                      pvVar21 = (void *)((long)pvVar21 + local_88);
                    } while (uVar9 != local_48);
                  }
                  lVar13 = lVar13 + (int)uVar5;
                } while (lVar13 < nnode);
              }
              free(output);
              free(pvVar6);
              free(original);
              free(sorted_index);
              return 0;
            }
            pcVar17 = "malloc xyzm of REF_DBL NULL";
            uVar11 = 0xb0;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar11
           ,"ref_gather_node_tec_part",pcVar17);
    RVar19 = 2;
  }
  else {
    lVar8 = 0;
    uVar3 = 0;
    do {
      if (l2c[lVar8] != -1) {
        uVar3 = uVar3 + (pRVar1->id == ref_node->part[lVar8]);
      }
      lVar8 = lVar8 + 1;
    } while (lVar13 != lVar8);
    if (-1 < (int)uVar3) goto LAB_0017b0f3;
    pcVar17 = "malloc sorted_local of REF_INT negative";
    uVar11 = 0x96;
LAB_0017b0df:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar11
           ,"ref_gather_node_tec_part",pcVar17);
    RVar19 = 1;
  }
  return RVar19;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_tec_part(REF_NODE ref_node,
                                                   REF_GLOB nnode,
                                                   REF_GLOB *l2c, REF_INT ldim,
                                                   REF_DBL *scalar,
                                                   FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB nnode_written, first, global;
  REF_INT local, n, i, id;
  REF_STATUS status;
  REF_INT dim = 3 + ldim + 1;
  REF_INT *sorted_local, *pack, total_cellnode, position;
  REF_GLOB *sorted_cellnode;

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      total_cellnode++;
    }
  }

  ref_malloc(sorted_local, total_cellnode, REF_INT);
  ref_malloc(sorted_cellnode, total_cellnode, REF_GLOB);
  ref_malloc(pack, total_cellnode, REF_INT);

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      sorted_cellnode[total_cellnode] = l2c[i];
      pack[total_cellnode] = i;
      total_cellnode++;
    }
  }
  RSS(ref_sort_heap_glob(total_cellnode, sorted_cellnode, sorted_local),
      "sort");
  for (i = 0; i < total_cellnode; i++) {
    sorted_local[i] = pack[sorted_local[i]];
    sorted_cellnode[i] = l2c[sorted_local[i]];
  }
  ref_free(pack);

  chunk = (REF_INT)(nnode / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);
  chunk = MIN(chunk, ref_mpi_reduce_chunk_limit(
                         ref_mpi, dim * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, dim * chunk, REF_DBL);
  ref_malloc(xyzm, dim * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < nnode) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk, nnode - nnode_written);

    nnode_written += n;

    for (i = 0; i < dim * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_sort_search_glob(total_cellnode, sorted_cellnode, global,
                                    &position);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status) {
        local = sorted_local[position];
        local_xyzm[0 + dim * i] = ref_node_xyz(ref_node, 0, local);
        local_xyzm[1 + dim * i] = ref_node_xyz(ref_node, 1, local);
        local_xyzm[2 + dim * i] = ref_node_xyz(ref_node, 2, local);
        for (id = 0; id < ldim; id++) {
          local_xyzm[3 + id + dim * i] = scalar[id + ldim * local];
        }
        local_xyzm[3 + ldim + dim * i] = 1.0;
      }
    }

    for (i = 0; i < n; i++) {
      if ((ABS(local_xyzm[3 + ldim + dim * i] - 1.0) > 0.1) &&
          (ABS(local_xyzm[3 + ldim + dim * i] - 0.0) > 0.1)) {
        printf("%s: %d: %s: before sum " REF_GLOB_FMT " %f\n", __FILE__,
               __LINE__, __func__, first + i, local_xyzm[3 + ldim + dim * i]);
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, dim * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi)) {
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[3 + ldim + dim * i] - 1.0) > 0.1) {
          printf("%s: %d: %s: after sum " REF_GLOB_FMT " %f\n", __FILE__,
                 __LINE__, __func__, first + i, xyzm[3 + ldim + dim * i]);
        }
        for (id = 0; id < 3 + ldim; id++) {
          fprintf(file, " %.15e", xyzm[id + dim * i]);
        }
        fprintf(file, " \n");
      }
    }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);
  ref_free(sorted_cellnode);
  ref_free(sorted_local);

  return REF_SUCCESS;
}